

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_cout_write.cpp
# Opt level: O0

void use_cout_write(void)

{
  size_t sVar1;
  void *this;
  int local_28;
  int i;
  int length;
  char *state3;
  char *state2;
  char *state1;
  
  sVar1 = strlen("May");
  std::operator<<((ostream *)&std::cout,"Increasing loop index:\n");
  for (local_28 = 1; local_28 <= (int)sVar1; local_28 = local_28 + 1) {
    std::ostream::write((char *)&std::cout,0x14614f);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"Decreasing loop index:\n");
  for (local_28 = (int)sVar1; 0 < local_28; local_28 = local_28 + -1) {
    std::ostream::write((char *)&std::cout,0x14614f);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"Exceeding string length:\n");
  this = (void *)std::ostream::write((char *)&std::cout,0x14614f);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"\n ok...\n");
  return;
}

Assistant:

void use_cout_write() {
    using namespace std;

    const char * state1 = "April";
    const char * state2 = "May";
    const char * state3 = "June";

    int length = std::strlen(state2);

    cout << "Increasing loop index:\n";
    int i;
    for(i = 1; i <= length; i++) {
        //  location, and size
        cout.write(state2, i);
        cout << endl;
    }

    cout << "Decreasing loop index:\n";
    for(i = length; i > 0; i--) {
        cout.write(state2, i);
        cout << endl;
    }

    cout << "Exceeding string length:\n";
    //  some strange memory data
    cout.write(state2, length + 5000) << endl;

    cout << "\n ok...\n";
}